

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int *__src;
  uint uVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  int *__dest;
  int iVar4;
  undefined7 in_register_00000031;
  int iVar5;
  
  pIVar2 = GImGui;
  uVar1 = GImGui->CurrentItemFlags | option;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar1 = ~option & GImGui->CurrentItemFlags;
  }
  iVar3 = (GImGui->ItemFlagsStack).Size;
  GImGui->CurrentItemFlags = uVar1;
  if (iVar3 == (pIVar2->ItemFlagsStack).Capacity) {
    if (iVar3 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar3 / 2 + iVar3;
    }
    iVar5 = iVar3 + 1;
    if (iVar3 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    __dest = (int *)MemAlloc((long)iVar5 << 2);
    __src = (pIVar2->ItemFlagsStack).Data;
    if (__src != (int *)0x0) {
      memcpy(__dest,__src,(long)(pIVar2->ItemFlagsStack).Size << 2);
      MemFree((pIVar2->ItemFlagsStack).Data);
    }
    (pIVar2->ItemFlagsStack).Data = __dest;
    (pIVar2->ItemFlagsStack).Capacity = iVar5;
    iVar3 = (pIVar2->ItemFlagsStack).Size;
  }
  else {
    __dest = (pIVar2->ItemFlagsStack).Data;
  }
  __dest[iVar3] = uVar1;
  (pIVar2->ItemFlagsStack).Size = (pIVar2->ItemFlagsStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}